

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util_test.cpp
# Opt level: O2

void __thiscall
ot::commissioner::FileUtil_SplitPath_Test::~FileUtil_SplitPath_Test(FileUtil_SplitPath_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(FileUtil, SplitPath)
{
    std::string path;
    std::string dirName  = "123";
    std::string baseName = "456";

    // directory and file
    path = "dir/ect/ory/file";
    SplitPath(path, dirName, baseName);
    EXPECT_TRUE(dirName == std::string("dir/ect/ory/"));
    EXPECT_TRUE(baseName == "file");

    // file only
    path = "file.name";
    SplitPath(path, dirName, baseName);
    EXPECT_TRUE(dirName.empty());
    EXPECT_TRUE(baseName == path);

    // pure directory
    path = "dir/ect/ory/";
    SplitPath(path, dirName, baseName);
    EXPECT_TRUE(dirName == path);
    EXPECT_TRUE(baseName.empty());
}